

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall TPZMatrix<double>::Transpose(TPZMatrix<double> *this,TPZMatrix<double> *T)

{
  long lVar1;
  long lVar2;
  undefined1 local_30 [8];
  
  (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])
            (T,(this->super_TPZBaseMatrix).fCol,(this->super_TPZBaseMatrix).fRow);
  if (0 < (this->super_TPZBaseMatrix).fRow) {
    lVar2 = 0;
    do {
      if (0 < (this->super_TPZBaseMatrix).fCol) {
        lVar1 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar2,lVar1);
          (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (T,lVar1,lVar2,local_30);
          lVar1 = lVar1 + 1;
        } while (lVar1 < (this->super_TPZBaseMatrix).fCol);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_TPZBaseMatrix).fRow);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Transpose(TPZMatrix<TVar> *T) const {
	T->Resize( Cols(), Rows() );
	
	for ( int64_t r = 0; r < Rows(); r++ ) {
        for ( int64_t c = 0; c < Cols(); c++ ) {
            T->PutVal( c, r, GetVal( r, c ) );
        }
    }
}